

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O3

int __thiscall HighsGFkSolve::link(HighsGFkSolve *this,char *__from,char *__to)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int *piVar5;
  pointer piVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  pointer piVar11;
  HighsInt y;
  long lVar12;
  int *piVar13;
  int iVar14;
  int local_40;
  int local_3c;
  pointer local_38;
  HighsInt Nleft;
  
  iVar10 = (int)__from;
  piVar3 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6[iVar10] = piVar4[piVar3[iVar10]];
  piVar11 = (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar11[iVar10] = -1;
  piVar4[piVar3[iVar10]] = iVar10;
  lVar7 = (long)piVar6[iVar10];
  if (lVar7 != -1) {
    piVar11[lVar7] = iVar10;
  }
  piVar8 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + piVar3[iVar10];
  *piVar8 = *piVar8 + 1;
  local_38 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  piVar4 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = local_38[iVar10];
  iVar9 = piVar4[iVar1];
  if (iVar9 != -1) {
    iVar14 = piVar3[iVar10];
    piVar8 = &local_3c;
    local_3c = -1;
    piVar13 = &local_40;
    local_40 = -1;
    piVar6 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar11 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      lVar7 = (long)iVar9;
      if (iVar14 < piVar3[lVar7]) {
        iVar2 = piVar6[lVar7];
        lVar12 = (long)iVar2;
        if (lVar12 == -1) {
          piVar11 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar14 = -1;
          goto LAB_002a063e;
        }
        if (iVar14 < piVar3[lVar12]) {
          piVar6[lVar7] = piVar11[lVar12];
          piVar11[lVar12] = iVar9;
          lVar7 = lVar12;
          iVar9 = iVar2;
          if (piVar6[lVar12] == -1) goto LAB_002a061f;
        }
        *piVar8 = iVar9;
        piVar5 = piVar6 + lVar7;
        piVar8 = piVar5;
      }
      else {
        if (iVar14 <= piVar3[lVar7]) goto LAB_002a061f;
        iVar2 = piVar11[lVar7];
        lVar12 = (long)iVar2;
        if (lVar12 == -1) goto LAB_002a061f;
        if (piVar3[lVar12] < iVar14) {
          piVar11[lVar7] = piVar6[lVar12];
          piVar6[lVar12] = iVar9;
          lVar7 = lVar12;
          iVar9 = iVar2;
          if (piVar11[lVar12] == -1) goto LAB_002a061f;
        }
        *piVar13 = iVar9;
        piVar5 = piVar11 + lVar7;
        piVar13 = piVar5;
      }
      iVar9 = *piVar5;
    } while( true );
  }
  (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar10] = -1;
  piVar6 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + iVar10;
LAB_002a0694:
  *piVar6 = -1;
  piVar4[iVar1] = iVar10;
  iVar10 = local_38[iVar10];
  piVar8 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + iVar10;
  *piVar8 = *piVar8 + 1;
  return iVar10;
LAB_002a061f:
  piVar6 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = piVar6[lVar7];
LAB_002a063e:
  *piVar13 = iVar14;
  *piVar8 = piVar11[lVar7];
  piVar6[lVar7] = local_40;
  piVar11[lVar7] = local_3c;
  piVar4[iVar1] = iVar9;
  if (piVar3[iVar10] < piVar3[lVar7]) {
    piVar6[iVar10] = piVar6[lVar7];
    iVar9 = piVar4[iVar1];
    piVar11[iVar10] = iVar9;
    piVar6 = piVar6 + iVar9;
  }
  else {
    piVar11[iVar10] = piVar11[lVar7];
    iVar9 = piVar4[iVar1];
    piVar6[iVar10] = iVar9;
    piVar6 = piVar11 + iVar9;
  }
  goto LAB_002a0694;
}

Assistant:

void HighsGFkSolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);
  ++rowsize[Arow[pos]];
}